

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O2

char * crnlib::crn_strdup(char *pStr)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  pcVar2 = "";
  if (pStr != (char *)0x0) {
    pcVar2 = pStr;
  }
  sVar1 = strlen(pcVar2);
  __dest = crnlib_malloc(sVar1 + 1);
  if (__dest != (void *)0x0) {
    pcVar2 = (char *)memcpy(__dest,pcVar2,sVar1 + 1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char* crn_strdup(const char* pStr)
    {
        if (!pStr)
        {
            pStr = "";
        }

        size_t l = strlen(pStr) + 1;
        char* p = (char*)crnlib_malloc(l);
        if (p)
        {
            memcpy(p, pStr, l);
        }

        return p;
    }